

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles2::Functional::anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::
getQuadLDRU(PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *this,int col,int row)

{
  int iVar1;
  const_reference pvVar2;
  int in_ECX;
  undefined4 in_register_00000034;
  int *piVar3;
  float x_;
  float y_;
  float z_;
  float w_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar4;
  Vec4 VVar5;
  int ndx11;
  int ndx00;
  int row_local;
  int col_local;
  PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *this_local;
  
  piVar3 = (int *)CONCAT44(in_register_00000034,col);
  iVar1 = (in_ECX * *piVar3 + row) * 4;
  pvVar2 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                     ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      (piVar3 + 2),(long)iVar1);
  x_ = tcu::Vector<float,_2>::x(pvVar2);
  pvVar2 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                     ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      (piVar3 + 2),(long)iVar1);
  y_ = tcu::Vector<float,_2>::y(pvVar2);
  pvVar2 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                     ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      (piVar3 + 2),(long)(iVar1 + 3));
  z_ = tcu::Vector<float,_2>::x(pvVar2);
  pvVar2 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                     ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      (piVar3 + 2),(long)(iVar1 + 3));
  w_ = tcu::Vector<float,_2>::y(pvVar2);
  uVar4 = (ulong)(uint)y_;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,w_);
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)(uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 PosTexCoordQuadGrid<TexType>::getQuadLDRU (int col, int row) const
{
	int ndx00 = (row*m_gridSize + col) * 4;
	int ndx11 = ndx00 + 3;

	return Vec4(m_positions[ndx00].x(),
				m_positions[ndx00].y(),
				m_positions[ndx11].x(),
				m_positions[ndx11].y());
}